

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * monty_pow(MontyContext *mc,mp_int *base,mp_int *exponent)

{
  BignumInt *__src;
  mp_int *pmVar1;
  mp_int *pmVar2;
  mp_int *pmVar3;
  bool bVar4;
  size_t j;
  long lVar5;
  size_t j_1;
  ulong uVar6;
  BignumInt BVar7;
  uint uVar8;
  size_t i;
  long lVar9;
  bool bVar10;
  mp_int *table [32];
  mp_int *local_138 [33];
  
  __src = mc->powers_of_r_mod_m[0]->w;
  pmVar1 = mp_make_sized(mc->powers_of_r_mod_m[0]->nw);
  memcpy(pmVar1->w,__src,pmVar1->nw << 3);
  lVar9 = 1;
  pmVar3 = pmVar1;
  local_138[0] = pmVar1;
  do {
    pmVar2 = mp_make_sized(mc->rw);
    monty_mul_into(mc,pmVar2,pmVar3,base);
    local_138[lVar9] = pmVar2;
    lVar9 = lVar9 + 1;
    pmVar3 = pmVar2;
  } while (lVar9 != 0x20);
  pmVar3 = mp_make_sized(mc->rw);
  uVar6 = mc->powers_of_r_mod_m[0]->nw;
  if (pmVar3->nw < uVar6) {
    uVar6 = pmVar3->nw;
  }
  memmove(pmVar3->w,mc->powers_of_r_mod_m[0]->w,uVar6 * 8);
  smemclr(pmVar3->w + uVar6,(pmVar3->nw - uVar6) * 8);
  pmVar2 = mp_make_sized(mc->rw);
  bVar4 = true;
  lVar9 = ((exponent->nw * 0x40 - 1) / 5) * 5;
  do {
    lVar5 = 0;
    uVar8 = 0;
    do {
      uVar6 = (ulong)(lVar9 + lVar5) >> 6;
      if (uVar6 < exponent->nw) {
        BVar7 = exponent->w[uVar6];
      }
      else {
        BVar7 = 0;
      }
      uVar8 = uVar8 | (uint)((BVar7 >> (lVar9 + lVar5 & 0x3fU) & 1) != 0) << ((byte)lVar5 & 0x1f);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    uVar6 = pmVar1->nw;
    if (pmVar2->nw < pmVar1->nw) {
      uVar6 = pmVar2->nw;
    }
    memmove(pmVar2->w,pmVar1->w,uVar6 * 8);
    smemclr(pmVar2->w + uVar6,(pmVar2->nw - uVar6) * 8);
    uVar6 = 1;
    do {
      mp_select_into(pmVar2,local_138[uVar6],pmVar2,(uint)((uVar6 ^ uVar8) + 0x1f >> 5));
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x20);
    if (bVar4) {
      uVar6 = pmVar2->nw;
      if (pmVar3->nw < pmVar2->nw) {
        uVar6 = pmVar3->nw;
      }
      memmove(pmVar3->w,pmVar2->w,uVar6 * 8);
      smemclr(pmVar3->w + uVar6,(pmVar3->nw - uVar6) * 8);
    }
    else {
      monty_mul_into(mc,pmVar3,pmVar3,pmVar2);
    }
    if (lVar9 == 0) break;
    lVar5 = 5;
    do {
      monty_mul_into(mc,pmVar3,pmVar3,pmVar3);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    bVar4 = false;
    bVar10 = lVar9 != 0;
    lVar9 = lVar9 + -5;
  } while (bVar10);
  lVar9 = 0;
  do {
    mp_free(local_138[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x20);
  mp_free(pmVar2);
  smemclr(mc->scratch->w,mc->scratch->nw << 3);
  return pmVar3;
}

Assistant:

mp_int *monty_pow(MontyContext *mc, mp_int *base, mp_int *exponent)
{
    /*
     * Modular exponentiation is done from the top down, using a
     * fixed-window technique.
     *
     * We have a table storing every power of the base from base^0 up
     * to base^{w-1}, where w is a small power of 2, say 2^k. (k is
     * defined above as MODPOW_LOG2_WINDOW_SIZE, and w = 2^k is
     * defined as MODPOW_WINDOW_SIZE.)
     *
     * We break the exponent up into k-bit chunks, from the bottom up,
     * that is
     *
     *   exponent = c_0 + 2^k c_1 + 2^{2k} c_2 + ... + 2^{nk} c_n
     *
     * and we compute base^exponent by computing in turn
     *
     *   base^{c_n}
     *   base^{2^k c_n + c_{n-1}}
     *   base^{2^{2k} c_n + 2^k c_{n-1} + c_{n-2}}
     *   ...
     *
     * where each line is obtained by raising the previous line to the
     * power 2^k (i.e. squaring it k times) and then multiplying in
     * a value base^{c_i}, which we can look up in our table.
     *
     * Side-channel considerations: the exponent is secret, so
     * actually doing a single table lookup by using a chunk of
     * exponent bits as an array index would be an obvious leak of
     * secret information into the cache. So instead, in each
     * iteration, we read _all_ the table entries, and do a sequence
     * of mp_select operations to leave just the one we wanted in the
     * variable that will go into the multiplication. In other
     * contexts (like software AES) that technique is so prohibitively
     * slow that it makes you choose a strategy that doesn't use table
     * lookups at all (we do bitslicing in preference); but here, this
     * iteration through 2^k table elements is replacing k-1 bignum
     * _multiplications_ that you'd have to use instead if you did
     * simple square-and-multiply, and that makes it still a win.
     */

    /* Table that holds base^0, ..., base^{w-1} */
    mp_int *table[MODPOW_WINDOW_SIZE];
    table[0] = mp_copy(monty_identity(mc));
    for (size_t i = 1; i < MODPOW_WINDOW_SIZE; i++)
        table[i] = monty_mul(mc, table[i-1], base);

    /* out accumulates the output value */
    mp_int *out = mp_make_sized(mc->rw);
    mp_copy_into(out, monty_identity(mc));

    /* table_entry will hold each value we get out of the table */
    mp_int *table_entry = mp_make_sized(mc->rw);

    /* Bit index of the chunk of bits we're working on. Start with the
     * highest multiple of k strictly less than the size of our
     * bignum, i.e. the highest-index chunk of bits that might
     * conceivably contain any nonzero bit. */
    size_t i = (exponent->nw * BIGNUM_INT_BITS) - 1;
    i -= i % MODPOW_LOG2_WINDOW_SIZE;

    bool first_iteration = true;

    while (true) {
        /* Construct the table index */
        unsigned table_index = 0;
        for (size_t j = 0; j < MODPOW_LOG2_WINDOW_SIZE; j++)
            table_index |= mp_get_bit(exponent, i+j) << j;

        /* Iterate through the table to do a side-channel-safe lookup,
         * ending up with table_entry = table[table_index] */
        mp_copy_into(table_entry, table[0]);
        for (size_t j = 1; j < MODPOW_WINDOW_SIZE; j++) {
            unsigned not_this_one =
                ((table_index ^ j) + MODPOW_WINDOW_SIZE - 1)
                >> MODPOW_LOG2_WINDOW_SIZE;
            mp_select_into(table_entry, table[j], table_entry, not_this_one);
        }

        if (!first_iteration) {
            /* Multiply into the output */
            monty_mul_into(mc, out, out, table_entry);
        } else {
            /* On the first iteration, we can save one multiplication
             * by just copying */
            mp_copy_into(out, table_entry);
            first_iteration = false;
        }

        /* If that was the bottommost chunk of bits, we're done */
        if (i == 0)
            break;

        /* Otherwise, square k times and go round again. */
        for (size_t j = 0; j < MODPOW_LOG2_WINDOW_SIZE; j++)
            monty_mul_into(mc, out, out, out);

        i-= MODPOW_LOG2_WINDOW_SIZE;
    }

    for (size_t i = 0; i < MODPOW_WINDOW_SIZE; i++)
        mp_free(table[i]);
    mp_free(table_entry);
    mp_clear(mc->scratch);
    return out;
}